

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

void __thiscall
despot::MemoryPool<despot::TagState>::~MemoryPool(MemoryPool<despot::TagState> *this)

{
  MemoryPool<despot::TagState> *this_local;
  
  DeleteAll(this);
  std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::~vector(&this->freelist_);
  std::
  vector<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ::~vector(&this->chunks_);
  return;
}

Assistant:

~MemoryPool() {
		DeleteAll();
	}